

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O3

void __thiscall gvr::Mesh::saveSTL(Mesh *this,char *name)

{
  float fVar1;
  float *pfVar2;
  int i;
  long lVar3;
  Mesh *pMVar4;
  uint *puVar5;
  int iVar6;
  char cVar7;
  float fVar8;
  double dVar9;
  uint32_t vi_5;
  uint32_t vi_4;
  uint32_t vi_3;
  uint32_t vi_2;
  uint32_t vi_1;
  uint32_t vi;
  SVector<float,_3> ret_2;
  SVector<float,_3> ret_1;
  SVector<float,_3> ret;
  Vector3d n;
  Vector6d pose;
  ofstream out;
  ostringstream header;
  float local_478;
  undefined4 local_474;
  undefined4 local_470;
  float local_46c;
  undefined4 local_468;
  undefined4 local_464;
  undefined8 local_460;
  float local_458;
  Mesh *local_450;
  float local_448 [4];
  float local_438 [4];
  double *local_428;
  double dStack_420;
  double local_418 [3];
  uint *local_400;
  undefined8 local_3f8;
  float local_3f0;
  undefined8 local_3e8;
  float local_3e0;
  SVector<double,_6> local_3d8;
  long local_3a8;
  filebuf local_3a0 [20];
  undefined4 auStack_38c [55];
  ios_base local_2b0 [264];
  long local_1a8;
  undefined8 local_1a0 [13];
  ios_base local_138 [264];
  
  local_450 = this;
  std::ofstream::ofstream(&local_3a8);
  lVar3 = *(long *)(local_3a8 + -0x18);
  *(undefined4 *)((long)auStack_38c + lVar3) = 5;
  std::ios::clear((int)&local_478 + (int)lVar3 + 0xd0);
  std::ofstream::open((char *)&local_3a8,(_Ios_Openmode)name);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"campose=",8);
  pMVar4 = local_450;
  local_428 = (double *)0x0;
  dStack_420 = 0.0;
  local_418[0] = 0.0;
  dVar9 = (double)gmath::recoverAngleAxis
                            ((SMatrix *)&(local_450->super_PointCloud).super_Model.Rc,
                             (SVector *)&local_428);
  local_3d8.v[2] = (pMVar4->super_PointCloud).super_Model.Tc.v[2];
  local_3d8.v[0] = (pMVar4->super_PointCloud).super_Model.Tc.v[0];
  local_3d8.v[1] = (pMVar4->super_PointCloud).super_Model.Tc.v[1];
  local_3d8.v[3] = 0.0;
  local_3d8.v[4] = 0.0;
  local_3d8.v[5] = 0.0;
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    local_3d8.v[3] = dVar9 * (double)local_428;
    local_3d8.v[4] = dVar9 * dStack_420;
    local_3d8.v[5] = dVar9 * local_418[0];
  }
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 5;
  gmath::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&local_1a8,&local_3d8);
  while (lVar3 = std::ostream::tellp(), lVar3 < 0x50) {
    local_428 = (double *)CONCAT71(local_428._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,(char *)&local_428,1);
  }
  std::__cxx11::stringbuf::str();
  std::ostream::write((char *)&local_3a8,(long)local_428);
  pMVar4 = local_450;
  if (local_428 != local_418) {
    operator_delete(local_428);
  }
  std::ostream::put((char)&local_3a8);
  std::ostream::put((char)&local_3a8);
  std::ostream::put((char)&local_3a8);
  std::ostream::put((char)&local_3a8);
  if (0 < pMVar4->n) {
    puVar5 = pMVar4->triangle;
    iVar6 = 0;
    do {
      pfVar2 = (pMVar4->super_PointCloud).vertex;
      local_428 = *(double **)(pfVar2 + (long)(int)*puVar5 * 3);
      dStack_420 = (double)CONCAT44(dStack_420._4_4_,pfVar2[(long)(int)*puVar5 * 3 + 2]);
      local_46c = pfVar2[(long)(int)puVar5[1] * 3 + 2];
      local_3e8 = *(undefined8 *)(pfVar2 + (long)(int)puVar5[1] * 3);
      local_3e0 = local_46c;
      local_478 = pfVar2[(long)(int)puVar5[2] * 3 + 2];
      local_3f8 = *(undefined8 *)(pfVar2 + (long)(int)puVar5[2] * 3);
      local_470 = (undefined4)local_3f8;
      local_474 = (undefined4)((ulong)local_3f8 >> 0x20);
      local_3f0 = local_478;
      local_438[2] = 0.0;
      local_438[0] = 0.0;
      local_438[1] = 0.0;
      local_464 = (undefined4)local_3e8;
      local_468 = (undefined4)((ulong)local_3e8 >> 0x20);
      lVar3 = 0;
      do {
        local_438[lVar3] =
             *(float *)((long)&local_3e8 + lVar3 * 4) - *(float *)((long)&local_428 + lVar3 * 4);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      local_448[2] = 0.0;
      local_448[0] = 0.0;
      local_448[1] = 0.0;
      lVar3 = 0;
      do {
        local_448[lVar3] =
             *(float *)((long)&local_3f8 + lVar3 * 4) - *(float *)((long)&local_428 + lVar3 * 4);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      local_460 = CONCAT44(local_448[0] * local_438[2] - local_438[0] * local_448[2],
                           local_448[2] * local_438[1] - local_438[2] * local_448[1]);
      local_458 = local_438[0] * local_448[1] - local_448[0] * local_438[1];
      fVar8 = 0.0;
      lVar3 = 0;
      do {
        fVar1 = *(float *)((long)&local_460 + lVar3 * 4);
        fVar8 = fVar8 + fVar1 * fVar1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      local_400 = puVar5;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      if (0.0 < fVar8) {
        lVar3 = 0;
        do {
          *(float *)((long)&local_460 + lVar3 * 4) =
               *(float *)((long)&local_460 + lVar3 * 4) / fVar8;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
      }
      cVar7 = (char)&local_3a8;
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      std::ostream::put(cVar7);
      puVar5 = local_400 + 3;
      iVar6 = iVar6 + 1;
      pMVar4 = local_450;
    } while (iVar6 < local_450->n);
  }
  std::ofstream::close();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_3a8 = _VTT;
  *(undefined8 *)(local_3a0 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_3a0);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

void Mesh::saveSTL(const char *name) const
{
  std::ofstream out;

  out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  out.open(name, std::ios_base::binary);

  // write header with camera definition

  std::ostringstream header;

  header << "campose=";
  gmath::Vector6d pose=gmath::getPose(getDefCameraR(), getDefCameraT());
  header << std::setprecision(5) << pose;

  while (header.tellp() < 80) header << ' ';

  out.write(header.str().c_str(), 80);

  // write number of triangles

  stlWriteUint32(out, static_cast<uint32_t>(n));

  unsigned int *tp=triangle;
  for (int i=0; i<n; i++)
  {
    // get vertices

    gmath::Vector3f v0=getVertex(tp[0]);
    gmath::Vector3f v1=getVertex(tp[1]);
    gmath::Vector3f v2=getVertex(tp[2]);

    // compute normal of triangle

    gmath::Vector3f vn=gmath::cross(v1-v0, v2-v0);
    float len=gmath::norm(vn);

    if (len > 0)
    {
      vn/=len;
    }

    // store normal

    stlWriteVector3f(out, vn);

    // store vertices

    stlWriteVector3f(out, v0);
    stlWriteVector3f(out, v1);
    stlWriteVector3f(out, v2);

    // store padding

    stlWriteUint16(out, 0);

    tp+=3;
  }

  out.close();
}